

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O3

void __thiscall mir::inst::RefInst::display(RefInst *this,ostream *o)

{
  __index_type _Var1;
  
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  std::__ostream_insert<char,std::char_traits<char>>(o," = &",4);
  _Var1 = (this->val).
          super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
          super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
          super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
          super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
          super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>._M_index
  ;
  if (_Var1 == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(o,"@",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (o,*(char **)&(this->val).
                            super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .
                            super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                            .
                            super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                            .
                            super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                            .
                            super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                            .
                            super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                            ._M_u,
               *(long *)&(this->val).
                         super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .
                         super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                         .
                         super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                         .
                         super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                         .
                         super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                         .
                         super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>
                         ._M_u._M_first._M_storage.id);
    return;
  }
  if (_Var1 == '\0') {
    (*(code *)**(undefined8 **)
                &(this->val).
                 super__Variant_base<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .super__Move_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
                 super__Copy_assign_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
                 super__Move_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
                 super__Copy_ctor_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
                 super__Variant_storage_alias<mir::inst::VarId,_std::__cxx11::basic_string<char>_>.
                 _M_u)(&this->val,o);
    return;
  }
  return;
}

Assistant:

void RefInst::display(std::ostream& o) const {
  o << dest << " = &";
  if (auto x = std::get_if<VarId>(&val)) {
    o << *x;
  } else if (auto x = std::get_if<std::string>(&val)) {
    o << "@" << *x;
  }
}